

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_huffman_codes.cpp
# Opt level: O0

bool lzham::generate_huffman_codes
               (void *pContext,uint num_syms,uint16 *pFreq,uint8 *pCodesizes,uint *max_code_size,
               uint *total_freq_ret,code_size_histogram *code_size_hist)

{
  uint uVar1;
  uint *puVar2;
  sym_freq *psVar3;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  uint *in_R8;
  int *in_R9;
  long in_stack_00000008;
  uint len;
  uint i_2;
  uint max_len;
  uint i_1;
  int x [1024];
  sym_freq *syms;
  sym_freq *sf;
  uint freq;
  uint i;
  uint num_used_syms;
  uint total_freq;
  uint max_freq;
  huffman_work_tables *state;
  uint local_1084;
  uint local_1074;
  uint local_1070;
  uint local_106c;
  uint local_1068 [798];
  sym_freq *in_stack_fffffffffffffc10;
  sym_freq *in_stack_fffffffffffffc18;
  uint in_stack_fffffffffffffc24;
  uint local_50;
  uint local_4c;
  int local_48;
  uint local_44;
  bool local_1;
  
  if ((in_ESI == 0) || (0x400 < in_ESI)) {
    local_1 = false;
  }
  else {
    local_44 = 0;
    local_48 = 0;
    local_4c = 0;
    for (local_50 = 0; local_50 < in_ESI; local_50 = local_50 + 1) {
      uVar1 = (uint)*(ushort *)(in_RDX + (ulong)local_50 * 2);
      if (uVar1 == 0) {
        *(undefined1 *)(in_RCX + (ulong)local_50) = 0;
      }
      else {
        local_48 = uVar1 + local_48;
        local_44 = math::maximum<unsigned_int>(local_44,uVar1);
        puVar2 = (uint *)(in_RDI + (ulong)local_4c * 8);
        *(short *)(puVar2 + 1) = (short)local_50;
        *(undefined2 *)((long)puVar2 + 6) = 0xffff;
        *puVar2 = uVar1;
        local_4c = local_4c + 1;
      }
    }
    *in_R9 = local_48;
    if (local_4c == 1) {
      *(undefined1 *)(in_RCX + (ulong)*(ushort *)(in_RDI + 4)) = 1;
      local_1 = true;
    }
    else {
      psVar3 = radix_sort_syms(in_stack_fffffffffffffc24,in_stack_fffffffffffffc18,
                               in_stack_fffffffffffffc10);
      for (local_106c = 0; local_106c < local_4c; local_106c = local_106c + 1) {
        local_1068[local_106c] = psVar3[local_106c].m_freq;
      }
      calculate_minimum_redundancy((int *)local_1068,local_4c);
      local_1070 = 0;
      for (local_1074 = 0; local_1074 < local_4c; local_1074 = local_1074 + 1) {
        uVar1 = local_1068[local_1074];
        local_1070 = math::maximum<unsigned_int>(uVar1,local_1070);
        local_1084 = uVar1;
        if (0x1f < uVar1) {
          local_1084 = 0x20;
        }
        *(int *)(in_stack_00000008 + (ulong)local_1084 * 4) =
             *(int *)(in_stack_00000008 + (ulong)local_1084 * 4) + 1;
        *(char *)(in_RCX + (ulong)psVar3[local_1074].m_left) = (char)uVar1;
      }
      *in_R8 = local_1070;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool generate_huffman_codes(void* pContext, uint num_syms, const uint16* pFreq, uint8* pCodesizes, uint& max_code_size, uint& total_freq_ret, code_size_histogram &code_size_hist)
   {
      if ((!num_syms) || (num_syms > cHuffmanMaxSupportedSyms))
         return false;
                  
      huffman_work_tables& state = *static_cast<huffman_work_tables*>(pContext);;
            
      uint max_freq = 0;
      uint total_freq = 0;
      
      uint num_used_syms = 0;
      for (uint i = 0; i < num_syms; i++)
      {
         uint freq = pFreq[i];
         
         if (!freq)
            pCodesizes[i] = 0;
         else
         {
            total_freq += freq;
            max_freq = math::maximum(max_freq, freq);
            
            sym_freq& sf = state.syms0[num_used_syms];
            sf.m_left = (uint16)i;
            sf.m_right = cUINT16_MAX;
            sf.m_freq = freq;
            num_used_syms++;
         }            
      }
      
      total_freq_ret = total_freq;

      if (num_used_syms == 1)
      {
         pCodesizes[state.syms0[0].m_left] = 1;
         return true;
      }

      sym_freq* syms = radix_sort_syms(num_used_syms, state.syms0, state.syms1);
      
      int x[cHuffmanMaxSupportedSyms];
      for (uint i = 0; i < num_used_syms; i++)
         x[i] = syms[i].m_freq;
      
      calculate_minimum_redundancy(x, num_used_syms);
      
      uint max_len = 0;
      for (uint i = 0; i < num_used_syms; i++)
      {
         uint len = x[i];
         max_len = math::maximum(len, max_len);
         code_size_hist.m_num_codes[LZHAM_MIN(len, (uint)code_size_histogram::cMaxUnlimitedHuffCodeSize)]++;
         pCodesizes[syms[i].m_left] = static_cast<uint8>(len);
      }
      max_code_size = max_len;
                  
      return true;
   }